

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

void cmd_ln_set_str_extra_r(cmd_ln_t *cmdln,char *name,char *str)

{
  int32 iVar1;
  char *pcVar2;
  cmd_ln_val_t *val;
  cmd_ln_val_t *local_20;
  
  iVar1 = hash_table_lookup(cmdln->ht,name,&local_20);
  if (iVar1 < 0) {
    local_20 = cmd_ln_val_init(8,name,str);
    hash_table_enter(cmdln->ht,local_20->name,local_20);
  }
  else {
    ckd_free((local_20->val).ptr);
    pcVar2 = __ckd_salloc__(str,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                            ,0x3f1);
    (local_20->val).ptr = pcVar2;
  }
  return;
}

Assistant:

void
cmd_ln_set_str_extra_r(cmd_ln_t *cmdln, char const *name, char const *str)
{
    cmd_ln_val_t *val;
    if (hash_table_lookup(cmdln->ht, name, (void **)&val) < 0) {
	val = cmd_ln_val_init(ARG_STRING, name, str);
	hash_table_enter(cmdln->ht, val->name, (void *)val);
    } else {
        ckd_free(val->val.ptr);
        val->val.ptr = ckd_salloc(str);
    }
}